

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QDBusMenuEvent>::insert
          (QMovableArrayOps<QDBusMenuEvent> *this,qsizetype i,qsizetype n,parameter_type t)

{
  QDBusMenuEvent **ppQVar1;
  qsizetype *pqVar2;
  QVariant *this_00;
  QDBusMenuEvent *pQVar3;
  long in_FS_OFFSET;
  bool bVar4;
  QDBusMenuEvent copy;
  Inserter local_b0;
  undefined1 local_88 [64];
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_88._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_88._56_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_88._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_88._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_88._4_4_ = 0xaaaaaaaa;
  local_88._0_4_ = t->m_id;
  local_88._8_8_ = (t->m_eventId).d.d;
  local_88._16_8_ = (t->m_eventId).d.ptr;
  local_88._24_8_ = (t->m_eventId).d.size;
  if ((QArrayData *)local_88._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((QArrayData *)local_88._8_8_)->ref_)->ref_)._q_value.super___atomic_base<int>.
    _M_i = (((QArrayData *)&((QArrayData *)local_88._8_8_)->ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  this_00 = (QVariant *)(local_88 + 0x20);
  ::QVariant::QVariant(this_00,&(t->m_data).m_variant);
  local_48 = (undefined1 *)CONCAT44(local_48._4_4_,t->m_timestamp);
  bVar4 = (this->super_QGenericArrayOps<QDBusMenuEvent>).super_QArrayDataPointer<QDBusMenuEvent>.
          size != 0;
  QArrayDataPointer<QDBusMenuEvent>::detachAndGrow
            ((QArrayDataPointer<QDBusMenuEvent> *)this,(uint)(i == 0 && bVar4),n,
             (QDBusMenuEvent **)0x0,(QArrayDataPointer<QDBusMenuEvent> *)0x0);
  if (i == 0 && bVar4) {
    for (; n != 0; n = n + -1) {
      pQVar3 = (this->super_QGenericArrayOps<QDBusMenuEvent>).
               super_QArrayDataPointer<QDBusMenuEvent>.ptr;
      pQVar3[-1].m_id = local_88._0_4_;
      pQVar3[-1].m_eventId.d.d = (Data *)local_88._8_8_;
      pQVar3[-1].m_eventId.d.ptr = (char16_t *)local_88._16_8_;
      pQVar3[-1].m_eventId.d.size = local_88._24_8_;
      if ((QArrayData *)local_88._8_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)local_88._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
             (((QArrayData *)local_88._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      ::QVariant::QVariant(&pQVar3[-1].m_data.m_variant,this_00);
      pQVar3[-1].m_timestamp = (uint)local_48;
      ppQVar1 = &(this->super_QGenericArrayOps<QDBusMenuEvent>).
                 super_QArrayDataPointer<QDBusMenuEvent>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
      pqVar2 = &(this->super_QGenericArrayOps<QDBusMenuEvent>).
                super_QArrayDataPointer<QDBusMenuEvent>.size;
      *pqVar2 = *pqVar2 + 1;
    }
  }
  else {
    local_b0.displaceFrom =
         (this->super_QGenericArrayOps<QDBusMenuEvent>).super_QArrayDataPointer<QDBusMenuEvent>.ptr
         + i;
    local_b0.displaceTo = local_b0.displaceFrom + n;
    local_b0.bytes =
         ((this->super_QGenericArrayOps<QDBusMenuEvent>).super_QArrayDataPointer<QDBusMenuEvent>.
          size - i) * 0x48;
    local_b0.data = (QArrayDataPointer<QDBusMenuEvent> *)this;
    local_b0.nInserts = n;
    memmove(local_b0.displaceTo,local_b0.displaceFrom,local_b0.bytes);
    Inserter::insertFill(&local_b0,(QDBusMenuEvent *)local_88,n);
    Inserter::~Inserter(&local_b0);
  }
  ::QVariant::~QVariant(this_00);
  if ((QArrayData *)local_88._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_88._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_88._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_88._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_88._8_8_,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        if (growsAtBegin) {
            // copy construct items in reverse order at the begin
            Q_ASSERT(this->freeSpaceAtBegin() >= n);
            while (n--) {
                new (this->begin() - 1) T(copy);
                --this->ptr;
                ++this->size;
            }
        } else {
            Inserter(this, i, n).insertFill(copy, n);
        }
    }